

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metainformation.cpp
# Opt level: O3

void __thiscall
hbm::streaming::MetaInformation::MetaInformation
          (MetaInformation *this,SocketNonblocking *socket,size_t size)

{
  pointer pBlock;
  bool bVar1;
  ostream *poVar2;
  size_type __new_size;
  int32_t typeBig;
  vector<char,_std::allocator<char>_> data;
  Reader reader;
  uint local_194;
  vector<char,_std::allocator<char>_> local_190;
  char *local_178;
  long local_170;
  char local_168 [16];
  string local_158;
  Reader local_138;
  
  this->m_type = 0;
  Json::Value::Value(&this->m_jsonContent,nullValue);
  (this->m_binaryContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_binaryContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_binaryContent).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (size < 5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"MetaInformation",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": invalid size",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  else {
    SocketNonblocking::receiveComplete(socket,&local_194,4);
    this->m_type = local_194 >> 0x18 | (local_194 & 0xff0000) >> 8 | (local_194 & 0xff00) << 8 |
                   local_194 << 0x18;
    __new_size = size - 4;
    if (local_194 == 0x1000000) {
      std::vector<char,_std::allocator<char>_>::vector
                (&local_190,__new_size,(allocator_type *)&local_138);
      SocketNonblocking::receiveComplete
                (socket,local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                 (long)local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      local_138.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map._0_1_ = 0;
      if (local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                  (&local_190,
                   (iterator)
                   local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,(char *)&local_138);
      }
      else {
        *local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_finish = '\0';
        local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      Json::Reader::Reader(&local_138);
      bVar1 = Json::Reader::parse(&local_138,
                                  local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start + __new_size,&this->m_jsonContent
                                  ,true);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"parsing meta \'",0xe);
        local_178 = local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,
                   local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + __new_size);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_178,local_170);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'information failed : ",0x16);
        Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_158,&local_138);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,local_158._M_dataplus._M_p,local_158._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if (local_178 != local_168) {
          operator_delete(local_178);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.commentsBefore_._M_dataplus._M_p != &local_138.commentsBefore_.field_2) {
        operator_delete(local_138.commentsBefore_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.document_._M_dataplus._M_p != &local_138.document_.field_2) {
        operator_delete(local_138.document_._M_dataplus._M_p);
      }
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                (&local_138.errors_);
      std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_138);
      if (local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_190.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_binaryContent,__new_size);
      pBlock = (this->m_binaryContent).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      SocketNonblocking::receiveComplete
                (socket,pBlock,
                 (long)(this->m_binaryContent).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pBlock);
    }
  }
  return;
}

Assistant:

MetaInformation::MetaInformation(SocketNonblocking &socket, size_t size)
			: m_type(0)
			, m_jsonContent()
			, m_binaryContent()
		{
			int32_t typeBig;

			if (size<=sizeof(typeBig)) {
				std::cerr << __FUNCTION__ << ": invalid size" <<std::endl;
				return;
			}

			socket.receiveComplete(&typeBig, sizeof(typeBig));

			m_type = ntohl(typeBig);
			if(m_type==METAINFORMATION_JSON) {
				size_t dataSize = size-sizeof(m_type);
				std::vector < char > data(dataSize);
				socket.receiveComplete(&data[0], data.size());
				data.push_back('\0');

				Json::Reader reader;
				if(reader.parse(&data[0], &data[dataSize], m_jsonContent)==false) {
					std::cerr << "parsing meta '" << std::string(&data[0], dataSize) << "'information failed : " << reader.getFormattedErrorMessages() << std::endl;
				}

			} else {
				m_binaryContent.resize(size-sizeof(m_type));
				socket.receiveComplete(&m_binaryContent[0], m_binaryContent.size());
			}
		}